

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void checkList(IntegrityCk *pCheck,int isFreeList,int iPage,int N,char *zContext)

{
  int iVar1;
  u32 uVar2;
  u32 iChild;
  u8 *p;
  ulong uVar3;
  bool bVar4;
  Pgno iFreePage;
  int n;
  uchar *pOvflData;
  DbPage *pOvflPage;
  uint local_30;
  int iFirst;
  int expected;
  int i;
  char *zContext_local;
  Pgno local_18;
  int N_local;
  int iPage_local;
  int isFreeList_local;
  IntegrityCk *pCheck_local;
  
  pOvflPage._4_4_ = iPage;
  local_30 = N;
  _expected = zContext;
  zContext_local._4_4_ = N;
  local_18 = iPage;
  N_local = isFreeList;
  _iPage_local = pCheck;
  while( true ) {
    bVar4 = false;
    if (0 < (int)zContext_local._4_4_) {
      bVar4 = _iPage_local->mxErr != 0;
    }
    if (!bVar4) {
      return;
    }
    if ((int)local_18 < 1) {
      uVar3 = (ulong)zContext_local._4_4_;
      zContext_local._4_4_ = zContext_local._4_4_ - 1;
      checkAppendMsg(_iPage_local,_expected,
                     "%d of %d pages missing from overflow list starting at %d",uVar3,
                     (ulong)local_30,(ulong)pOvflPage._4_4_);
      return;
    }
    zContext_local._4_4_ = zContext_local._4_4_ - 1;
    iVar1 = checkRef(_iPage_local,local_18,_expected);
    if (iVar1 != 0) break;
    iVar1 = sqlite3PagerAcquire(_iPage_local->pPager,local_18,(DbPage **)&pOvflData,0);
    if (iVar1 != 0) {
      checkAppendMsg(_iPage_local,_expected,"failed to get page %d",(ulong)local_18);
      return;
    }
    p = (u8 *)sqlite3PagerGetData((DbPage *)pOvflData);
    if (N_local == 0) {
      if ((_iPage_local->pBt->autoVacuum != '\0') && (0 < (int)zContext_local._4_4_)) {
        iFirst = sqlite3Get4byte(p);
        checkPtrmap(_iPage_local,iFirst,'\x04',local_18,_expected);
      }
    }
    else {
      uVar2 = sqlite3Get4byte(p + 4);
      if (_iPage_local->pBt->autoVacuum != '\0') {
        checkPtrmap(_iPage_local,local_18,'\x02',0,_expected);
      }
      if ((int)_iPage_local->pBt->usableSize / 4 + -2 < (int)uVar2) {
        checkAppendMsg(_iPage_local,_expected,"freelist leaf count too big on page %d",
                       (ulong)local_18);
        zContext_local._4_4_ = zContext_local._4_4_ - 1;
      }
      else {
        for (iFirst = 0; iFirst < (int)uVar2; iFirst = iFirst + 1) {
          iChild = sqlite3Get4byte(p + (iFirst * 4 + 8));
          if (_iPage_local->pBt->autoVacuum != '\0') {
            checkPtrmap(_iPage_local,iChild,'\x02',0,_expected);
          }
          checkRef(_iPage_local,iChild,_expected);
        }
        zContext_local._4_4_ = zContext_local._4_4_ - uVar2;
      }
    }
    local_18 = sqlite3Get4byte(p);
    sqlite3PagerUnref((DbPage *)pOvflData);
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  int iPage,            /* Page number for first page in the list */
  int N,                /* Expected number of pages in the list */
  char *zContext        /* Context for error messages */
){
  int i;
  int expected = N;
  int iFirst = iPage;
  while( N-- > 0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( iPage<1 ){
      checkAppendMsg(pCheck, zContext,
         "%d of %d pages missing from overflow list starting at %d",
          N+1, expected, iFirst);
      break;
    }
    if( checkRef(pCheck, iPage, zContext) ) break;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage) ){
      checkAppendMsg(pCheck, zContext, "failed to get page %d", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      int n = get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0, zContext);
      }
#endif
      if( n>(int)pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck, zContext,
           "freelist leaf count too big on page %d", iPage);
        N--;
      }else{
        for(i=0; i<n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0, zContext);
          }
#endif
          checkRef(pCheck, iFreePage, zContext);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage, zContext);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);
  }
}